

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_sha2.c
# Opt level: O0

void cmSHA1_Internal_Transform(SHA_CTX *context,sha_word32 *data)

{
  uint uVar1;
  sha_word32 sVar2;
  sha_word32 sVar3;
  uint local_3c;
  sha_word32 tmp;
  int j;
  sha_word32 *W1;
  sha_word32 T1;
  sha_word32 e;
  sha_word32 d;
  sha_word32 c;
  sha_word32 b;
  sha_word32 a;
  sha_word32 *data_local;
  SHA_CTX *context_local;
  
  d = (context->s1).state[1];
  e = (context->s1).state[2];
  T1 = (context->s1).state[3];
  W1._4_4_ = (context->s1).state[4];
  local_3c = 0;
  c = (context->s1).state[0];
  _b = data;
  do {
    uVar1 = *_b >> 0x10 | *_b << 0x10;
    *(uint *)((long)context + (long)(int)local_3c * 4 + 0x20) =
         (uVar1 & 0xff00ff00) >> 8 | (uVar1 & 0xff00ff) << 8;
    sVar2 = (c << 5 | c >> 0x1b) + (d & e ^ (d ^ 0xffffffff) & T1) + W1._4_4_ + 0x5a827999 +
            *(int *)((long)context + (long)(int)local_3c * 4 + 0x20);
    W1._4_4_ = T1;
    T1 = e;
    e = d << 0x1e | d >> 2;
    d = c;
    local_3c = local_3c + 1;
    c = sVar2;
    _b = _b + 1;
  } while ((int)local_3c < 0x10);
  do {
    uVar1 = *(uint *)((long)context + (long)(int)(local_3c + 0xd & 0xf) * 4 + 0x20) ^
            *(uint *)((long)context + (long)(int)(local_3c + 8 & 0xf) * 4 + 0x20) ^
            *(uint *)((long)context + (long)(int)(local_3c + 2 & 0xf) * 4 + 0x20) ^
            *(uint *)((long)context + (long)(int)(local_3c & 0xf) * 4 + 0x20);
    uVar1 = uVar1 << 1 | uVar1 >> 0x1f;
    *(uint *)((long)context + (long)(int)(local_3c & 0xf) * 4 + 0x20) = uVar1;
    sVar2 = (c << 5 | c >> 0x1b) + (d & e ^ (d ^ 0xffffffff) & T1) + W1._4_4_ + 0x5a827999 + uVar1;
    W1._4_4_ = T1;
    T1 = e;
    e = d << 0x1e | d >> 2;
    d = c;
    local_3c = local_3c + 1;
    c = sVar2;
  } while ((int)local_3c < 0x14);
  do {
    uVar1 = *(uint *)((long)context + (long)(int)(local_3c + 0xd & 0xf) * 4 + 0x20) ^
            *(uint *)((long)context + (long)(int)(local_3c + 8 & 0xf) * 4 + 0x20) ^
            *(uint *)((long)context + (long)(int)(local_3c + 2 & 0xf) * 4 + 0x20) ^
            *(uint *)((long)context + (long)(int)(local_3c & 0xf) * 4 + 0x20);
    uVar1 = uVar1 << 1 | uVar1 >> 0x1f;
    *(uint *)((long)context + (long)(int)(local_3c & 0xf) * 4 + 0x20) = uVar1;
    sVar2 = (c << 5 | c >> 0x1b) + (d ^ e ^ T1) + W1._4_4_ + 0x6ed9eba1 + uVar1;
    W1._4_4_ = T1;
    T1 = e;
    e = d << 0x1e | d >> 2;
    d = c;
    local_3c = local_3c + 1;
    c = sVar2;
  } while ((int)local_3c < 0x28);
  do {
    uVar1 = *(uint *)((long)context + (long)(int)(local_3c + 0xd & 0xf) * 4 + 0x20) ^
            *(uint *)((long)context + (long)(int)(local_3c + 8 & 0xf) * 4 + 0x20) ^
            *(uint *)((long)context + (long)(int)(local_3c + 2 & 0xf) * 4 + 0x20) ^
            *(uint *)((long)context + (long)(int)(local_3c & 0xf) * 4 + 0x20);
    uVar1 = uVar1 << 1 | uVar1 >> 0x1f;
    *(uint *)((long)context + (long)(int)(local_3c & 0xf) * 4 + 0x20) = uVar1;
    sVar3 = (c << 5 | c >> 0x1b) + (d & e ^ d & T1 ^ e & T1) + W1._4_4_ + -0x70e44324 + uVar1;
    W1._4_4_ = T1;
    T1 = e;
    e = d << 0x1e | d >> 2;
    d = c;
    local_3c = local_3c + 1;
    sVar2 = T1;
    uVar1 = e;
    c = sVar3;
  } while ((int)local_3c < 0x3c);
  do {
    c = sVar3;
    e = uVar1;
    T1 = sVar2;
    uVar1 = *(uint *)((long)context + (long)(int)(local_3c + 0xd & 0xf) * 4 + 0x20) ^
            *(uint *)((long)context + (long)(int)(local_3c + 8 & 0xf) * 4 + 0x20) ^
            *(uint *)((long)context + (long)(int)(local_3c + 2 & 0xf) * 4 + 0x20) ^
            *(uint *)((long)context + (long)(int)(local_3c & 0xf) * 4 + 0x20);
    uVar1 = uVar1 << 1 | uVar1 >> 0x1f;
    *(uint *)((long)context + (long)(int)(local_3c & 0xf) * 4 + 0x20) = uVar1;
    sVar3 = (c << 5 | c >> 0x1b) + (d ^ e ^ T1) + W1._4_4_ + -0x359d3e2a + uVar1;
    W1._4_4_ = T1;
    uVar1 = d << 0x1e | d >> 2;
    d = c;
    local_3c = local_3c + 1;
    sVar2 = e;
  } while ((int)local_3c < 0x50);
  (context->s1).state[0] = sVar3 + (context->s1).state[0];
  (context->s1).state[1] = c + (context->s1).state[1];
  (context->s1).state[2] = uVar1 + (context->s1).state[2];
  (context->s1).state[3] = e + (context->s1).state[3];
  (context->s1).state[4] = T1 + (context->s1).state[4];
  return;
}

Assistant:

void SHA1_Internal_Transform(SHA_CTX* context, const sha_word32* data) {
	sha_word32	a, b, c, d, e;
	sha_word32	T1, *W1;
	int		j;

	W1 = (sha_word32*)context->s1.buffer;

	/* Initialize registers with the prev. intermediate value */
	a = context->s1.state[0];
	b = context->s1.state[1];
	c = context->s1.state[2];
	d = context->s1.state[3];
	e = context->s1.state[4];
	j = 0;
	do {
#if BYTE_ORDER == LITTLE_ENDIAN
		T1 = data[j];
		/* Copy data while converting to host byte order */
		REVERSE32(*data++, W1[j]);
		T1 = ROTL32(5, a) + Ch(b, c, d) + e + K1_0_TO_19 + W1[j];
#else /* BYTE_ORDER == LITTLE_ENDIAN */
		T1 = ROTL32(5, a) + Ch(b, c, d) + e + K1_0_TO_19 + (W1[j] = *data++);
#endif /* BYTE_ORDER == LITTLE_ENDIAN */
		e = d;
		d = c;
		c = ROTL32(30, b);
		b = a;
		a = T1;
		j++;
	} while (j < 16);

	do {
		T1 = W1[(j+13)&0x0f] ^ W1[(j+8)&0x0f] ^ W1[(j+2)&0x0f] ^ W1[j&0x0f];
		T1 = ROTL32(5, a) + Ch(b,c,d) + e + K1_0_TO_19 + (W1[j&0x0f] = ROTL32(1, T1));
		e = d;
		d = c;
		c = ROTL32(30, b);
		b = a;
		a = T1;
		j++;
	} while (j < 20);

	do {
		T1 = W1[(j+13)&0x0f] ^ W1[(j+8)&0x0f] ^ W1[(j+2)&0x0f] ^ W1[j&0x0f];
		T1 = ROTL32(5, a) + Parity(b,c,d) + e + K1_20_TO_39 + (W1[j&0x0f] = ROTL32(1, T1));
		e = d;
		d = c;
		c = ROTL32(30, b);
		b = a;
		a = T1;
		j++;
	} while (j < 40);

	do {
		T1 = W1[(j+13)&0x0f] ^ W1[(j+8)&0x0f] ^ W1[(j+2)&0x0f] ^ W1[j&0x0f];
		T1 = ROTL32(5, a) + Maj(b,c,d) + e + K1_40_TO_59 + (W1[j&0x0f] = ROTL32(1, T1));
		e = d;
		d = c;
		c = ROTL32(30, b);
		b = a;
		a = T1;
		j++;
	} while (j < 60);

	do {
		T1 = W1[(j+13)&0x0f] ^ W1[(j+8)&0x0f] ^ W1[(j+2)&0x0f] ^ W1[j&0x0f];
		T1 = ROTL32(5, a) + Parity(b,c,d) + e + K1_60_TO_79 + (W1[j&0x0f] = ROTL32(1, T1));
		e = d;
		d = c;
		c = ROTL32(30, b);
		b = a;
		a = T1;
		j++;
	} while (j < 80);


	/* Compute the current intermediate hash value */
	context->s1.state[0] += a;
	context->s1.state[1] += b;
	context->s1.state[2] += c;
	context->s1.state[3] += d;
	context->s1.state[4] += e;

	/* Clean up */
	a = b = c = d = e = T1 = 0;
}